

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testNumberOfNeighborsWithDefaultValueOutOfRange(void)

{
  KNearestNeighborsClassifier *this;
  Int64Parameter *this_00;
  Int64Range *pIVar1;
  NearestNeighborsIndex *this_01;
  ostream *poVar2;
  undefined1 local_98 [8];
  Result res;
  SingleKdTreeIndex *kdTree;
  NearestNeighborsIndex *nnIndex;
  Int64Parameter *numberOfNeighbors;
  KNearestNeighborsClassifier *knnClassifier;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  this = CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  this_00 = CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors(this);
  pIVar1 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
  CoreML::Specification::Int64Range::set_minvalue(pIVar1,1);
  pIVar1 = CoreML::Specification::Int64Parameter::mutable_range(this_00);
  CoreML::Specification::Int64Range::set_maxvalue(pIVar1,10);
  CoreML::Specification::Int64Parameter::set_defaultvalue(this_00,0xf);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting(this);
  this_01 = CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex(this);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance(this_01);
  res.m_message.field_2._8_8_ =
       CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex(this_01);
  CoreML::Specification::SingleKdTreeIndex::set_leafsize
            ((SingleKdTreeIndex *)res.m_message.field_2._8_8_,0x1e);
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel<char_const(&)[8]>
            (this,(char (*) [8])"Default");
  CoreML::validate<(MLModelType)404>((Result *)local_98,(Model *)local_40);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_98);
  if (m1._oneof_case_[0]._0_1_) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1e3);
    poVar2 = std::operator<<(poVar2,": error: ");
    poVar2 = std::operator<<(poVar2,"!((res).good())");
    poVar2 = std::operator<<(poVar2," was false, expected true.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_98);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testNumberOfNeighborsWithDefaultValueOutOfRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(15);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since numberOfNeighbors defaultValue is out of range bounds.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}